

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

Error __thiscall asmjit::CodeHolder::relocateToBase(CodeHolder *this,uint64_t baseAddress)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  size_type sVar4;
  Value VVar5;
  void *pvVar6;
  CodeHolder *pCVar7;
  Slot *pSVar8;
  bool bVar9;
  uint8_t uVar10;
  Error EVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  AddressTableEntry *pAVar15;
  Slot *pSVar16;
  uint64_t *out;
  Value unaff_RBX;
  bool bVar17;
  Value VVar18;
  CodeHolder *pCVar19;
  uint uVar20;
  long lVar21;
  Value unaff_R12;
  undefined8 unaff_R13;
  ulong uVar22;
  ulong *puVar23;
  uint64_t unaff_R15;
  uint64_t value;
  ulong auStack_d0 [2];
  Value VStack_c0;
  ulong uStack_b8;
  Slot *pSStack_b0;
  Value VStack_a8;
  Value VStack_a0;
  ulong uStack_98;
  CodeHolder *pCStack_90;
  uint64_t uStack_88;
  code *pcStack_80;
  CodeHolder *local_70;
  Error local_64;
  size_t local_60;
  long local_58;
  ulong local_50;
  CodeHolder *local_48;
  ulong local_40;
  uint8_t *local_38;
  
  if (baseAddress == 0xffffffffffffffff) {
    return 2;
  }
  this->_baseAddress = baseAddress;
  bVar1 = (this->_environment)._arch;
  uVar22 = CONCAT71((int7)((ulong)unaff_R13 >> 8),bVar1);
  VVar5 = (Value)this->_addressTableSection;
  uVar14 = 0;
  VVar18.constant = baseAddress;
  pCVar19 = this;
  if ((Section *)VVar5.constant == (Section *)0x0) {
    local_58 = 0;
  }
  else {
    unaff_R12.expression = (Expression *)(VVar5.constant + 0x48);
    if (*(size_t *)(VVar5.constant + 0x58) < (VVar5.label)->_offset) {
      if ((*(byte *)(VVar5.constant + 0x60) & 2) != 0) {
        return 9;
      }
      pcStack_80 = (code *)0x1148f6;
      VVar18.expression = unaff_R12.expression;
      EVar11 = CodeHolder_reserveInternal
                         (this,(CodeBuffer *)unaff_R12.expression,(VVar5.label)->_offset);
      unaff_RBX = VVar5;
      unaff_R15 = baseAddress;
      if (EVar11 != 0) {
        return EVar11;
      }
    }
    local_58._0_1_ = *(uint8_t *)unaff_R12;
    local_58._1_1_ = ((uint8_t *)((long)unaff_R12 + 1))[0];
    local_58._2_1_ = ((uint8_t *)((long)unaff_R12 + 1))[1];
    local_58._3_1_ = ((uint8_t *)((long)unaff_R12 + 3))[0];
    local_58._4_1_ = ((uint8_t *)((long)unaff_R12 + 3))[1];
    local_58._5_1_ = ((uint8_t *)((long)unaff_R12 + 3))[2];
    local_58._6_1_ = ((uint8_t *)((long)unaff_R12 + 3))[3];
    local_58._7_1_ = ((uint8_t *)((long)unaff_R12 + 3))[4];
  }
  uVar12 = (ulong)(this->_relocations).super_ZoneVectorBase._size;
  if (uVar12 != 0) {
    unaff_R12 = (Value)(this->_relocations).super_ZoneVectorBase._data;
    local_38 = (unaff_R12.expression)->valueType + uVar12 * 8 + -1;
    local_50 = (ulong)(bVar1 & 1) ^ 3;
    uVar14 = 0;
    local_48 = this;
LAB_00114950:
    unaff_R15 = *unaff_R12.constant;
    iVar2 = *(int *)(unaff_R15 + 4);
    if (iVar2 == 0) goto LAB_00114b34;
    uVar20 = (this->_sections).super_ZoneVectorBase._size;
    if (uVar20 <= *(uint *)(unaff_R15 + 0x10)) {
      pcStack_80 = (code *)0x114c13;
      relocateToBase();
      return 0x18;
    }
    pvVar6 = (this->_sections).super_ZoneVectorBase._data;
    lVar13 = *(long *)((long)pvVar6 + (ulong)*(uint *)(unaff_R15 + 0x10) * 8);
    uVar3 = *(uint *)(unaff_R15 + 0x14);
    if ((ulong)uVar3 == 0xffffffff) {
      lVar21 = 0;
    }
    else {
      if (uVar20 <= uVar3) {
        pcStack_80 = (code *)0x114c22;
        relocateToBase();
        return 2;
      }
      lVar21 = *(long *)((long)pvVar6 + (ulong)uVar3 * 8);
    }
    pCVar19 = *(CodeHolder **)(unaff_R15 + 0x20);
    uVar12 = *(ulong *)(unaff_R15 + 0x18);
    if (*(ulong *)(lVar13 + 0x50) <= uVar12) {
      return 0x18;
    }
    local_64 = 0x18;
    out = (uint64_t *)(ulong)*(byte *)(unaff_R15 + 10);
    if ((uint64_t *)(*(ulong *)(lVar13 + 0x50) - uVar12) < out) {
      return 0x18;
    }
    if (4 < iVar2 - 1U) {
      return 0x18;
    }
    VVar18 = (Value)((Value *)(lVar13 + 0x10))->expression;
    local_60 = *(size_t *)(lVar13 + 0x48);
    unaff_RBX.expression = (Expression *)(*(byte *)(unaff_R15 + 0xc) + uVar12);
    local_70 = pCVar19;
    switch(iVar2) {
    case 1:
      VVar18.expression = (Expression *)&local_70;
      uVar22 = uVar22 & 0xffffffff;
      pcStack_80 = (code *)0x114a15;
      local_40 = uVar14;
      EVar11 = CodeHolder_evaluateExpression(pCVar19,VVar18.expression,out);
      uVar14 = local_40;
      this = local_48;
      if (EVar11 != 0) {
        return EVar11;
      }
      break;
    case 2:
      goto switchD_001149fb_caseD_2;
    case 3:
      if (lVar21 == 0) {
        return 0x18;
      }
      pCVar19 = (CodeHolder *)
                ((long)(pCVar19->_allocator)._slots + *(long *)(lVar21 + 0x10) + baseAddress + -0x48
                );
      local_70 = pCVar19;
      goto switchD_001149fb_caseD_2;
    case 4:
      VVar18.expression = (Expression *)((VVar18.expression)->valueType + (baseAddress - 1));
      local_70 = (CodeHolder *)
                 ((long)pCVar19 -
                 (long)((long)out + (long)((VVar18.expression)->valueType + (uVar12 - 1))));
      pCVar19 = local_70;
      if ((uVar22 & 1) != 0) goto switchD_001149fb_caseD_2;
      pCVar19 = (CodeHolder *)((ulong)&local_70[0x6bca1a]._addressTableSection >> 0x20);
      if (pCVar19 != (CodeHolder *)0x0) {
        return 0x19;
      }
      break;
    case 5:
      if (unaff_RBX.constant < (Section *)0x2) {
        return 0x18;
      }
      if (*(char *)(unaff_R15 + 0xb) != '\x04') {
        return 0x18;
      }
      local_70 = (CodeHolder *)
                 ((long)pCVar19 -
                 (long)((long)out +
                       (long)((VVar18.expression)->valueType + baseAddress + uVar12 + -1)));
      if ((CodeHolder *)(long)(int)local_70 == local_70) goto switchD_001149fb_caseD_2;
      pAVar15 = (this->_addressTableEntries)._root;
      while( true ) {
        if (pAVar15 == (AddressTableEntry *)0x0) {
          return 0x18;
        }
        pCVar7 = (CodeHolder *)pAVar15->_address;
        uVar20 = (uint)(pCVar7 >= pCVar19 && pCVar7 != pCVar19) - (uint)(pCVar7 < pCVar19);
        if (uVar20 == 0) break;
        pAVar15 = (AddressTableEntry *)
                  ((pAVar15->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                   _rbNodeData[uVar20 >> 0x1f] & 0xfffffffffffffffe);
      }
      if ((Section *)VVar5.constant == (Section *)0x0) goto LAB_00114c2e;
      uVar20 = pAVar15->_slot;
      if (uVar20 == 0xffffffff) {
        uVar20 = (uint)uVar14;
        pAVar15->_slot = uVar20;
        uVar14 = (ulong)(uVar20 + 1);
      }
      pCVar19 = (CodeHolder *)((ulong)uVar20 << ((byte)local_50 & 0x3f));
      local_70 = (CodeHolder *)
                 (((long)(VVar5.expression)->value[1].expression -
                  (long)((VVar18.expression)->valueType + (uVar12 - 1) + (long)out)) + (long)pCVar19
                 );
      if ((CodeHolder *)(long)(int)local_70 != local_70) {
        return 0x19;
      }
      uVar10 = '\x15';
      if ((unaff_RBX.expression)->valueType[local_60 - 2] != 0xe8) {
        if ((unaff_RBX.expression)->valueType[local_60 - 2] != 0xe9) {
          return 0x18;
        }
        uVar10 = '%';
      }
      (unaff_RBX.expression)->valueType[local_60 - 3] = 0xff;
      (unaff_RBX.expression)->valueType[local_60 - 2] = uVar10;
      *(undefined8 *)((long)(pCVar19->_allocator)._slots + local_58 + -0x48) =
           *(undefined8 *)(unaff_R15 + 0x20);
    }
    goto LAB_00114aee;
  }
LAB_00114bc0:
  sVar4 = (this->_sectionsByOrder).super_ZoneVectorBase._size;
  if (sVar4 != 0) {
    if (*(Section **)
         ((long)(this->_sectionsByOrder).super_ZoneVectorBase._data + (ulong)(sVar4 - 1) * 8) ==
        (Section *)VVar5.constant) {
      uVar14 = (ulong)(uint)((int)uVar14 << ((byte)uVar22 & 1 ^ 3));
      *(ulong *)(VVar5.constant + 0x50) = uVar14;
      (VVar5.label)->_offset = uVar14;
    }
    return 0;
  }
  pcStack_80 = (code *)0x114c2e;
  relocateToBase();
LAB_00114c2e:
  pcStack_80 = CodeHolder_evaluateExpression;
  relocateToBase();
  lVar13 = 0;
  puVar23 = auStack_d0;
  bVar9 = true;
  VStack_c0 = VVar18;
  VStack_a8 = unaff_RBX;
  VStack_a0 = unaff_R12;
  uStack_98 = uVar22;
  pCStack_90 = this;
  uStack_88 = unaff_R15;
  pcStack_80 = (code *)uVar14;
  do {
    bVar17 = bVar9;
    pSVar16 = (Slot *)(ulong)*(byte *)((long)(pCVar19->_allocator)._slots + lVar13 + -0x47);
    if ((Slot *)0x3 < pSVar16) {
      return 3;
    }
    switch(pSVar16) {
    case (Slot *)0x1:
      pSVar16 = (pCVar19->_allocator)._slots[lVar13 + -8];
      break;
    case (Slot *)0x2:
      pSVar16 = (pCVar19->_allocator)._slots[lVar13 + -8];
      pSVar8 = pSVar16[4].next;
      if (pSVar8 == (Slot *)0x0) {
        return 0x43;
      }
      pSVar16 = (Slot *)((long)&(pSVar8[2].next)->next + (long)&(pSVar16[3].next)->next);
      break;
    case (Slot *)0x3:
      EVar11 = CodeHolder_evaluateExpression
                         ((CodeHolder *)(pCVar19->_allocator)._slots[lVar13 + -8],
                          (Expression *)&pSStack_b0,
                          (uint64_t *)
                          ((long)&switchD_00114c75::switchdataD_00136004 +
                          (long)(int)(&switchD_00114c75::switchdataD_00136004)[(long)pSVar16]));
      pSVar16 = pSStack_b0;
      if (EVar11 != 0) {
        return EVar11;
      }
    }
    *puVar23 = (ulong)pSVar16;
    lVar13 = 1;
    puVar23 = &uStack_b8;
    bVar9 = false;
  } while (bVar17);
  switch((pCVar19->_environment)._arch) {
  case '\0':
    uVar14 = uStack_b8 + auStack_d0[0];
    break;
  case '\x01':
    uVar14 = auStack_d0[0] - uStack_b8;
    break;
  case '\x02':
    uVar14 = uStack_b8 * auStack_d0[0];
    break;
  case '\x03':
    auStack_d0[0] = auStack_d0[0] << ((byte)uStack_b8 & 0x3f);
    goto LAB_00114d20;
  case '\x04':
    auStack_d0[0] = auStack_d0[0] >> ((byte)uStack_b8 & 0x3f);
LAB_00114d20:
    uVar14 = 0;
    if (uStack_b8 < 0x40) {
      uVar14 = auStack_d0[0];
    }
    break;
  case '\x05':
    uVar14 = 0x3f;
    if (uStack_b8 < 0x3f) {
      uVar14 = uStack_b8;
    }
    uVar14 = (long)auStack_d0[0] >> ((byte)uVar14 & 0x3f);
    break;
  default:
    return 3;
  }
  (VStack_c0.expression)->opType = (char)uVar14;
  (VStack_c0.expression)->valueType[0] = (char)(uVar14 >> 8);
  (VStack_c0.expression)->valueType[1] = (char)(uVar14 >> 0x10);
  (VStack_c0.expression)->reserved[0] = (char)(uVar14 >> 0x18);
  (VStack_c0.expression)->reserved[1] = (char)(uVar14 >> 0x20);
  (VStack_c0.expression)->reserved[2] = (char)(uVar14 >> 0x28);
  (VStack_c0.expression)->reserved[3] = (char)(uVar14 >> 0x30);
  (VStack_c0.expression)->reserved[4] = (char)(uVar14 >> 0x38);
  return 0;
switchD_001149fb_caseD_2:
LAB_00114aee:
  switch(*(undefined1 *)(unaff_R15 + 0xb)) {
  case 1:
    (unaff_RBX.expression)->valueType[local_60 - 1] = (uint8_t)local_70;
    break;
  case 2:
    *(undefined2 *)((unaff_RBX.expression)->valueType + (local_60 - 1)) = local_70._0_2_;
    break;
  default:
    return local_64;
  case 4:
    *(undefined4 *)((unaff_RBX.expression)->valueType + (local_60 - 1)) = local_70._0_4_;
    break;
  case 8:
    *(CodeHolder **)((unaff_RBX.expression)->valueType + (local_60 - 1)) = local_70;
  }
LAB_00114b34:
  unaff_R12.expression = (Expression *)(unaff_R12.expression)->value;
  if ((uint8_t *)unaff_R12.constant == local_38) goto LAB_00114bc0;
  goto LAB_00114950;
}

Assistant:

Error CodeHolder::relocateToBase(uint64_t baseAddress) noexcept {
  // Base address must be provided.
  if (ASMJIT_UNLIKELY(baseAddress == Globals::kNoBaseAddress))
    return DebugUtils::errored(kErrorInvalidArgument);

  _baseAddress = baseAddress;
  uint32_t addressSize = _environment.registerSize();

  Section* addressTableSection = _addressTableSection;
  uint32_t addressTableEntryCount = 0;
  uint8_t* addressTableEntryData = nullptr;

  if (addressTableSection) {
    ASMJIT_PROPAGATE(
      reserveBuffer(&addressTableSection->_buffer, size_t(addressTableSection->virtualSize())));
    addressTableEntryData = addressTableSection->_buffer.data();
  }

  // Relocate all recorded locations.
  for (const RelocEntry* re : _relocations) {
    // Possibly deleted or optimized-out entry.
    if (re->relocType() == RelocEntry::kTypeNone)
      continue;

    Section* sourceSection = sectionById(re->sourceSectionId());
    Section* targetSection = nullptr;

    if (re->targetSectionId() != Globals::kInvalidId)
      targetSection = sectionById(re->targetSectionId());

    uint64_t value = re->payload();
    uint64_t sectionOffset = sourceSection->offset();
    uint64_t sourceOffset = re->sourceOffset();

    // Make sure that the `RelocEntry` doesn't go out of bounds.
    size_t regionSize = re->format().regionSize();
    if (ASMJIT_UNLIKELY(re->sourceOffset() >= sourceSection->bufferSize() ||
                        sourceSection->bufferSize() - size_t(re->sourceOffset()) < regionSize))
      return DebugUtils::errored(kErrorInvalidRelocEntry);

    uint8_t* buffer = sourceSection->data();
    size_t valueOffset = size_t(re->sourceOffset()) + re->format().valueOffset();

    switch (re->relocType()) {
      case RelocEntry::kTypeExpression: {
        Expression* expression = (Expression*)(uintptr_t(value));
        ASMJIT_PROPAGATE(CodeHolder_evaluateExpression(this, expression, &value));
        break;
      }

      case RelocEntry::kTypeAbsToAbs: {
        break;
      }

      case RelocEntry::kTypeRelToAbs: {
        // Value is currently a relative offset from the start of its section.
        // We have to convert it to an absolute offset (including base address).
        if (ASMJIT_UNLIKELY(!targetSection))
          return DebugUtils::errored(kErrorInvalidRelocEntry);

        //value += baseAddress + sectionOffset + sourceOffset + regionSize;
        value += baseAddress + targetSection->offset();
        break;
      }

      case RelocEntry::kTypeAbsToRel: {
        value -= baseAddress + sectionOffset + sourceOffset + regionSize;
        if (addressSize > 4 && !Support::isInt32(int64_t(value)))
          return DebugUtils::errored(kErrorRelocOffsetOutOfRange);
        break;
      }

      case RelocEntry::kTypeX64AddressEntry: {
        if (re->format().valueSize() != 4 || valueOffset < 2)
          return DebugUtils::errored(kErrorInvalidRelocEntry);

        // First try whether a relative 32-bit displacement would work.
        value -= baseAddress + sectionOffset + sourceOffset + regionSize;
        if (!Support::isInt32(int64_t(value))) {
          // Relative 32-bit displacement is not possible, use '.addrtab' section.
          AddressTableEntry* atEntry = _addressTableEntries.get(re->payload());
          if (ASMJIT_UNLIKELY(!atEntry))
            return DebugUtils::errored(kErrorInvalidRelocEntry);

          // Cannot be null as we have just matched the `AddressTableEntry`.
          ASMJIT_ASSERT(addressTableSection != nullptr);

          if (!atEntry->hasAssignedSlot())
            atEntry->_slot = addressTableEntryCount++;

          size_t atEntryIndex = size_t(atEntry->slot()) * addressSize;
          uint64_t addrSrc = sectionOffset + sourceOffset + regionSize;
          uint64_t addrDst = addressTableSection->offset() + uint64_t(atEntryIndex);

          value = addrDst - addrSrc;
          if (!Support::isInt32(int64_t(value)))
            return DebugUtils::errored(kErrorRelocOffsetOutOfRange);

          // Bytes that replace [REX, OPCODE] bytes.
          uint32_t byte0 = 0xFF;
          uint32_t byte1 = buffer[valueOffset - 1];

          if (byte1 == 0xE8) {
            // Patch CALL/MOD byte to FF /2 (-> 0x15).
            byte1 = x86EncodeMod(0, 2, 5);
          }
          else if (byte1 == 0xE9) {
            // Patch JMP/MOD byte to FF /4 (-> 0x25).
            byte1 = x86EncodeMod(0, 4, 5);
          }
          else {
            return DebugUtils::errored(kErrorInvalidRelocEntry);
          }

          // Patch `jmp/call` instruction.
          buffer[valueOffset - 2] = uint8_t(byte0);
          buffer[valueOffset - 1] = uint8_t(byte1);

          Support::writeU64uLE(addressTableEntryData + atEntryIndex, re->payload());
        }
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidRelocEntry);
    }

    switch (re->format().valueSize()) {
      case 1:
        Support::writeU8(buffer + valueOffset, uint32_t(value & 0xFFu));
        break;

      case 2:
        Support::writeU16uLE(buffer + valueOffset, uint32_t(value & 0xFFFFu));
        break;

      case 4:
        Support::writeU32uLE(buffer + valueOffset, uint32_t(value & 0xFFFFFFFFu));
        break;

      case 8:
        Support::writeU64uLE(buffer + valueOffset, value);
        break;

      default:
        return DebugUtils::errored(kErrorInvalidRelocEntry);
    }
  }

  // Fixup the virtual size of the address table if it's the last section.
  if (_sectionsByOrder.last() == addressTableSection) {
    size_t addressTableSize = addressTableEntryCount * addressSize;
    addressTableSection->_buffer._size = addressTableSize;
    addressTableSection->_virtualSize = addressTableSize;
  }

  return kErrorOk;
}